

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O0

int __thiscall Imf_3_3::DeepTiledOutputFile::levelWidth(DeepTiledOutputFile *this,int lx)

{
  int iVar1;
  undefined8 in_RDI;
  stringstream _iex_replace_s;
  BaseExc *e;
  int retVal;
  LevelRoundingMode in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe3c;
  
  iVar1 = levelSize((int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_fffffffffffffe3c,
                    in_stack_fffffffffffffe38);
  return iVar1;
}

Assistant:

int
DeepTiledOutputFile::levelWidth (int lx) const
{
    try
    {
        int retVal = levelSize (
            _data->minX, _data->maxX, lx, _data->tileDesc.roundingMode);

        return retVal;
    }
    catch (IEX_NAMESPACE::BaseExc& e)
    {
        REPLACE_EXC (
            e,
            "Error calling levelWidth() on image "
            "file \""
                << fileName () << "\". " << e.what ());
        throw;
    }
}